

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

bool __thiscall ServerService::startService(ServerService *this)

{
  sockaddr_storage clientDetails_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ServerSegment *pSVar4;
  ostream *poVar5;
  byte *pbVar6;
  int local_6c4;
  string local_6c0 [4];
  int i;
  allocator local_689;
  string local_688 [8];
  string key;
  ServerSegment *segment;
  byte local_658 [7];
  bool flag;
  byte buffer [1472];
  sockaddr_storage clientDetails;
  socklen_t clientLength;
  ServerService *this_local;
  
  memset(local_658,0,0x5c0);
  bVar1 = false;
  clientDetails.__ss_align._4_4_ = 0x80;
  do {
    iVar3 = ServerSocketUDP::getSocket(this->serverSocketUDP);
    recvfrom(iVar3,local_658,0x5c0,0,(sockaddr *)(buffer + 0x5b8),
             (socklen_t *)((long)&clientDetails.__ss_align + 4));
    pSVar4 = parseRequest(this,local_658);
    if ((pSVar4->data != (byte *)0x0) && (pSVar4->ackFlag == 'N')) {
      std::operator<<((ostream *)&std::cout,"Received: ");
      poVar5 = std::operator<<((ostream *)&std::cout,(char *)pSVar4->data);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pbVar6 = pSVar4->data;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_688,(char *)pbVar6,&local_689);
      std::allocator<char>::~allocator((allocator<char> *)&local_689);
      std::operator+((char *)local_6c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "I received ");
      std::__cxx11::string::operator=(local_688,local_6c0);
      std::__cxx11::string::~string(local_6c0);
      for (local_6c4 = 0; local_6c4 < 200; local_6c4 = local_6c4 + 1) {
        std::__cxx11::string::operator+=
                  (local_688,"123 hjg ghjfhdjg hj cjchjfghjcghjc   yjccgyjvghjvg jyy yjcgyj vyj");
      }
      pbVar6 = (byte *)std::__cxx11::string::c_str();
      iVar3 = ServerSocketUDP::getSocket(this->serverSocketUDP);
      clientDetails_00.__ss_padding._6_8_ = clientDetails._0_8_;
      clientDetails_00._0_8_ = buffer._1464_8_;
      clientDetails_00.__ss_padding[0xe] = clientDetails.__ss_padding[6];
      clientDetails_00.__ss_padding[0xf] = clientDetails.__ss_padding[7];
      clientDetails_00.__ss_padding[0x10] = clientDetails.__ss_padding[8];
      clientDetails_00.__ss_padding[0x11] = clientDetails.__ss_padding[9];
      clientDetails_00.__ss_padding[0x12] = clientDetails.__ss_padding[10];
      clientDetails_00.__ss_padding[0x13] = clientDetails.__ss_padding[0xb];
      clientDetails_00.__ss_padding[0x14] = clientDetails.__ss_padding[0xc];
      clientDetails_00.__ss_padding[0x15] = clientDetails.__ss_padding[0xd];
      clientDetails_00.__ss_padding[0x16] = clientDetails.__ss_padding[0xe];
      clientDetails_00.__ss_padding[0x17] = clientDetails.__ss_padding[0xf];
      clientDetails_00.__ss_padding[0x18] = clientDetails.__ss_padding[0x10];
      clientDetails_00.__ss_padding[0x19] = clientDetails.__ss_padding[0x11];
      clientDetails_00.__ss_padding[0x1a] = clientDetails.__ss_padding[0x12];
      clientDetails_00.__ss_padding[0x1b] = clientDetails.__ss_padding[0x13];
      clientDetails_00.__ss_padding[0x1c] = clientDetails.__ss_padding[0x14];
      clientDetails_00.__ss_padding[0x1d] = clientDetails.__ss_padding[0x15];
      clientDetails_00.__ss_padding[0x1e] = clientDetails.__ss_padding[0x16];
      clientDetails_00.__ss_padding[0x1f] = clientDetails.__ss_padding[0x17];
      clientDetails_00.__ss_padding[0x20] = clientDetails.__ss_padding[0x18];
      clientDetails_00.__ss_padding[0x21] = clientDetails.__ss_padding[0x19];
      clientDetails_00.__ss_padding[0x22] = clientDetails.__ss_padding[0x1a];
      clientDetails_00.__ss_padding[0x23] = clientDetails.__ss_padding[0x1b];
      clientDetails_00.__ss_padding[0x24] = clientDetails.__ss_padding[0x1c];
      clientDetails_00.__ss_padding[0x25] = clientDetails.__ss_padding[0x1d];
      clientDetails_00.__ss_padding[0x26] = clientDetails.__ss_padding[0x1e];
      clientDetails_00.__ss_padding[0x27] = clientDetails.__ss_padding[0x1f];
      clientDetails_00.__ss_padding[0x28] = clientDetails.__ss_padding[0x20];
      clientDetails_00.__ss_padding[0x29] = clientDetails.__ss_padding[0x21];
      clientDetails_00.__ss_padding[0x2a] = clientDetails.__ss_padding[0x22];
      clientDetails_00.__ss_padding[0x2b] = clientDetails.__ss_padding[0x23];
      clientDetails_00.__ss_padding[0x2c] = clientDetails.__ss_padding[0x24];
      clientDetails_00.__ss_padding[0x2d] = clientDetails.__ss_padding[0x25];
      clientDetails_00.__ss_padding[0x2e] = clientDetails.__ss_padding[0x26];
      clientDetails_00.__ss_padding[0x2f] = clientDetails.__ss_padding[0x27];
      clientDetails_00.__ss_padding[0x30] = clientDetails.__ss_padding[0x28];
      clientDetails_00.__ss_padding[0x31] = clientDetails.__ss_padding[0x29];
      clientDetails_00.__ss_padding[0x32] = clientDetails.__ss_padding[0x2a];
      clientDetails_00.__ss_padding[0x33] = clientDetails.__ss_padding[0x2b];
      clientDetails_00.__ss_padding[0x34] = clientDetails.__ss_padding[0x2c];
      clientDetails_00.__ss_padding[0x35] = clientDetails.__ss_padding[0x2d];
      clientDetails_00.__ss_padding[0x36] = clientDetails.__ss_padding[0x2e];
      clientDetails_00.__ss_padding[0x37] = clientDetails.__ss_padding[0x2f];
      clientDetails_00.__ss_padding[0x38] = clientDetails.__ss_padding[0x30];
      clientDetails_00.__ss_padding[0x39] = clientDetails.__ss_padding[0x31];
      clientDetails_00.__ss_padding[0x3a] = clientDetails.__ss_padding[0x32];
      clientDetails_00.__ss_padding[0x3b] = clientDetails.__ss_padding[0x33];
      clientDetails_00.__ss_padding[0x3c] = clientDetails.__ss_padding[0x34];
      clientDetails_00.__ss_padding[0x3d] = clientDetails.__ss_padding[0x35];
      clientDetails_00.__ss_padding[0x3e] = clientDetails.__ss_padding[0x36];
      clientDetails_00.__ss_padding[0x3f] = clientDetails.__ss_padding[0x37];
      clientDetails_00.__ss_padding[0x40] = clientDetails.__ss_padding[0x38];
      clientDetails_00.__ss_padding[0x41] = clientDetails.__ss_padding[0x39];
      clientDetails_00.__ss_padding[0x42] = clientDetails.__ss_padding[0x3a];
      clientDetails_00.__ss_padding[0x43] = clientDetails.__ss_padding[0x3b];
      clientDetails_00.__ss_padding[0x44] = clientDetails.__ss_padding[0x3c];
      clientDetails_00.__ss_padding[0x45] = clientDetails.__ss_padding[0x3d];
      clientDetails_00.__ss_padding[0x46] = clientDetails.__ss_padding[0x3e];
      clientDetails_00.__ss_padding[0x47] = clientDetails.__ss_padding[0x3f];
      clientDetails_00.__ss_padding[0x48] = clientDetails.__ss_padding[0x40];
      clientDetails_00.__ss_padding[0x49] = clientDetails.__ss_padding[0x41];
      clientDetails_00.__ss_padding[0x4a] = clientDetails.__ss_padding[0x42];
      clientDetails_00.__ss_padding[0x4b] = clientDetails.__ss_padding[0x43];
      clientDetails_00.__ss_padding[0x4c] = clientDetails.__ss_padding[0x44];
      clientDetails_00.__ss_padding[0x4d] = clientDetails.__ss_padding[0x45];
      clientDetails_00.__ss_padding[0x4e] = clientDetails.__ss_padding[0x46];
      clientDetails_00.__ss_padding[0x4f] = clientDetails.__ss_padding[0x47];
      clientDetails_00.__ss_padding[0x50] = clientDetails.__ss_padding[0x48];
      clientDetails_00.__ss_padding[0x51] = clientDetails.__ss_padding[0x49];
      clientDetails_00.__ss_padding[0x52] = clientDetails.__ss_padding[0x4a];
      clientDetails_00.__ss_padding[0x53] = clientDetails.__ss_padding[0x4b];
      clientDetails_00.__ss_padding[0x54] = clientDetails.__ss_padding[0x4c];
      clientDetails_00.__ss_padding[0x55] = clientDetails.__ss_padding[0x4d];
      clientDetails_00.__ss_padding[0x56] = clientDetails.__ss_padding[0x4e];
      clientDetails_00.__ss_padding[0x57] = clientDetails.__ss_padding[0x4f];
      clientDetails_00.__ss_padding[0x58] = clientDetails.__ss_padding[0x50];
      clientDetails_00.__ss_padding[0x59] = clientDetails.__ss_padding[0x51];
      clientDetails_00.__ss_padding[0x5a] = clientDetails.__ss_padding[0x52];
      clientDetails_00.__ss_padding[0x5b] = clientDetails.__ss_padding[0x53];
      clientDetails_00.__ss_padding[0x5c] = clientDetails.__ss_padding[0x54];
      clientDetails_00.__ss_padding[0x5d] = clientDetails.__ss_padding[0x55];
      clientDetails_00.__ss_padding[0x5e] = clientDetails.__ss_padding[0x56];
      clientDetails_00.__ss_padding[0x5f] = clientDetails.__ss_padding[0x57];
      clientDetails_00.__ss_padding[0x60] = clientDetails.__ss_padding[0x58];
      clientDetails_00.__ss_padding[0x61] = clientDetails.__ss_padding[0x59];
      clientDetails_00.__ss_padding[0x62] = clientDetails.__ss_padding[0x5a];
      clientDetails_00.__ss_padding[99] = clientDetails.__ss_padding[0x5b];
      clientDetails_00.__ss_padding[100] = clientDetails.__ss_padding[0x5c];
      clientDetails_00.__ss_padding[0x65] = clientDetails.__ss_padding[0x5d];
      clientDetails_00.__ss_padding[0x66] = clientDetails.__ss_padding[0x5e];
      clientDetails_00.__ss_padding[0x67] = clientDetails.__ss_padding[0x5f];
      clientDetails_00.__ss_padding[0x68] = clientDetails.__ss_padding[0x60];
      clientDetails_00.__ss_padding[0x69] = clientDetails.__ss_padding[0x61];
      clientDetails_00.__ss_padding[0x6a] = clientDetails.__ss_padding[0x62];
      clientDetails_00.__ss_padding[0x6b] = clientDetails.__ss_padding[99];
      clientDetails_00.__ss_padding[0x6c] = clientDetails.__ss_padding[100];
      clientDetails_00.__ss_padding[0x6d] = clientDetails.__ss_padding[0x65];
      clientDetails_00.__ss_padding[0x6e] = clientDetails.__ss_padding[0x66];
      clientDetails_00.__ss_padding[0x6f] = clientDetails.__ss_padding[0x67];
      clientDetails_00.__ss_padding[0x70] = clientDetails.__ss_padding[0x68];
      clientDetails_00.__ss_padding[0x71] = clientDetails.__ss_padding[0x69];
      clientDetails_00.__ss_padding[0x72] = clientDetails.__ss_padding[0x6a];
      clientDetails_00.__ss_padding[0x73] = clientDetails.__ss_padding[0x6b];
      clientDetails_00.__ss_padding[0x74] = clientDetails.__ss_padding[0x6c];
      clientDetails_00.__ss_padding[0x75] = clientDetails.__ss_padding[0x6d];
      clientDetails_00.__ss_align._0_1_ = clientDetails.__ss_padding[0x6e];
      clientDetails_00.__ss_align._1_1_ = clientDetails.__ss_padding[0x6f];
      clientDetails_00.__ss_align._2_1_ = clientDetails.__ss_padding[0x70];
      clientDetails_00.__ss_align._3_1_ = clientDetails.__ss_padding[0x71];
      clientDetails_00.__ss_align._4_1_ = clientDetails.__ss_padding[0x72];
      clientDetails_00.__ss_align._5_1_ = clientDetails.__ss_padding[0x73];
      clientDetails_00.__ss_align._6_1_ = clientDetails.__ss_padding[0x74];
      clientDetails_00.__ss_align._7_1_ = clientDetails.__ss_padding[0x75];
      bVar2 = sendSegments(this,pbVar6,iVar3,clientDetails_00,this->receiverWindowSize);
      if (bVar2) {
        bVar1 = true;
      }
      std::__cxx11::string::~string(local_688);
    }
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Sent all segments. Closing server connection."
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  } while( true );
}

Assistant:

bool ServerService::startService() {

    socklen_t clientLength;
    struct sockaddr_storage clientDetails;
    byte buffer[MTU];
    bzero(buffer, MTU);
    bool flag = false;
    clientLength = sizeof(clientDetails);
    while (true) {
        recvfrom(serverSocketUDP->getSocket(), buffer, MTU, 0, (struct sockaddr *) &clientDetails, &clientLength);
        ServerSegment *segment = parseRequest(buffer);
        if (segment->data && segment->ackFlag == 'N') {
            cout << "Received: ";
            cout << (char *) segment->data << endl;
            string key = (char *) segment->data;
            key = "I received " + key;
            for (int i = 0; i < 200; ++i) {
                key += "123 hjg ghjfhdjg hj cjchjfghjcghjc   yjccgyjvghjvg jyy yjcgyj vyj";
            }
//            todo 对收到信息做处理，并响应请求
            if (sendSegments((byte *) key.c_str(), serverSocketUDP->getSocket(), clientDetails, receiverWindowSize)) {
                flag = true;
            }
        }
        if (flag) {
            cout << "Sent all segments. Closing server connection." << endl;
//            break;
        }
    }
}